

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall
OpenMesh::PolyConnectivity::split(PolyConnectivity *this,FaceHandle fh,VertexHandle vh)

{
  HalfedgeHandle HVar1;
  BaseHandle BVar2;
  VertexHandle VVar3;
  BaseHandle _nheh;
  BaseHandle _fh;
  Halfedge *pHVar4;
  Face *pFVar5;
  Vertex *pVVar6;
  BaseHandle _heh;
  BaseHandle _heh_00;
  HalfedgeHandle _heh_01;
  
  HVar1 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,fh);
  BVar2.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar1);
  VVar3 = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar1);
  _nheh.idx_ = (int)ArrayKernel::new_edge(&this->super_ArrayKernel,VVar3,vh);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,HVar1,(HalfedgeHandle)_nheh.idx_);
  _heh_00.idx_ = _nheh.idx_;
  _fh = fh.super_BaseHandle.idx_;
  while( true ) {
    _heh.idx_ = BVar2.idx_;
    pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.idx_);
    (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = _fh.idx_;
    _heh_01.super_BaseHandle.idx_ = (BaseHandle)((-(_nheh.idx_ & 1U) | 1) + _nheh.idx_);
    if ((BaseHandle)_heh.idx_ == HVar1.super_BaseHandle.idx_) break;
    BVar2.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh.idx_);
    _fh.idx_ = (int)ArrayKernel::new_face(&this->super_ArrayKernel);
    pFVar5 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh.idx_);
    (pFVar5->halfedge_handle_).super_BaseHandle.idx_ = _heh.idx_;
    VVar3 = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_);
    _nheh.idx_ = (int)ArrayKernel::new_edge(&this->super_ArrayKernel,VVar3,vh);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)_nheh.idx_,_heh_01);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,_heh_01,(HalfedgeHandle)_heh.idx_);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_,(HalfedgeHandle)_nheh.idx_);
    pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_nheh.idx_);
    (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = _fh.idx_;
    pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
    (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = _fh.idx_;
    _heh_00.idx_ = _heh.idx_;
  }
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_01,HVar1);
  HVar1 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar1);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,HVar1,_heh_01);
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)fh.super_BaseHandle.idx_;
  pVVar6 = ArrayKernel::vertex(&this->super_ArrayKernel,vh);
  (pVVar6->halfedge_handle_).super_BaseHandle.idx_ = (int)_heh_01.super_BaseHandle.idx_;
  return;
}

Assistant:

void PolyConnectivity::split(FaceHandle fh, VertexHandle vh)
{
  HalfedgeHandle hend = halfedge_handle(fh);
  HalfedgeHandle hh   = next_halfedge_handle(hend);

  HalfedgeHandle hold = new_edge(to_vertex_handle(hend), vh);

  set_next_halfedge_handle(hend, hold);
  set_face_handle(hold, fh);

  hold = opposite_halfedge_handle(hold);

  while (hh != hend) {

    HalfedgeHandle hnext = next_halfedge_handle(hh);

    FaceHandle fnew = new_face();
    set_halfedge_handle(fnew, hh);

    HalfedgeHandle hnew = new_edge(to_vertex_handle(hh), vh);

    set_next_halfedge_handle(hnew, hold);
    set_next_halfedge_handle(hold, hh);
    set_next_halfedge_handle(hh, hnew);

    set_face_handle(hnew, fnew);
    set_face_handle(hold, fnew);
    set_face_handle(hh,   fnew);

    hold = opposite_halfedge_handle(hnew);

    hh = hnext;
  }

  set_next_halfedge_handle(hold, hend);
  set_next_halfedge_handle(next_halfedge_handle(hend), hold);

  set_face_handle(hold, fh);

  set_halfedge_handle(vh, hold);
}